

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiveBuilder.cpp
# Opt level: O2

bool __thiscall
ZAP::ArchiveBuilder::build(ArchiveBuilder *this,ostream *stream,Compression compression)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  char cVar3;
  bool bVar4;
  undefined4 uVar5;
  undefined4 *puVar6;
  _Base_ptr p_Var7;
  int field;
  long lVar8;
  FileList *__range1;
  undefined4 *puVar9;
  uint32_t original_filesize;
  uint32_t archive_filesize;
  char *filedata;
  Compression local_250;
  uint32_t index;
  undefined4 *local_248;
  uint32_t tableSize;
  ifstream entryFile;
  
  bVar2 = supportsCompression(compression);
  if (bVar2) {
    _entryFile = 0x415a;
    std::ostream::write((char *)stream,(long)&entryFile);
    anon_unknown.dwarf_2160a::writeField<unsigned_char>(stream,'\0');
    local_250 = compression;
    anon_unknown.dwarf_2160a::writeField<unsigned_char>(stream,(uchar)compression);
    tableSize = (uint32_t)(this->files)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    (anonymous_namespace)::writeField<unsigned_int*>(stream,&tableSize);
    puVar6 = (undefined4 *)operator_new__((ulong)tableSize << 2);
    p_Var1 = &(this->files)._M_t._M_impl.super__Rb_tree_header;
    puVar9 = puVar6;
    for (p_Var7 = (this->files)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var7 != p_Var1; p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
      lVar8 = *(long *)(p_Var7 + 2);
      std::ostream::write((char *)stream,lVar8);
      field = (int)lVar8;
      uVar5 = std::ostream::tellp();
      *puVar9 = uVar5;
      anon_unknown.dwarf_2160a::writeField<int>(stream,field);
      anon_unknown.dwarf_2160a::writeField<int>(stream,field);
      anon_unknown.dwarf_2160a::writeField<int>(stream,field);
      puVar9 = puVar9 + 1;
    }
    local_248 = puVar6;
    for (p_Var7 = (this->files)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var7 != p_Var1; p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
      index = std::ostream::tellp();
      original_filesize = 0;
      archive_filesize = 0;
      std::ifstream::ifstream(&entryFile,(string *)(p_Var7 + 1),_S_in|_S_bin|_S_ate);
      cVar3 = std::__basic_file<char>::is_open();
      if (cVar3 != '\0') {
        original_filesize = std::istream::tellg();
        std::istream::seekg(&entryFile,0,0);
        filedata = (char *)operator_new__((ulong)original_filesize);
        std::istream::read((char *)&entryFile,(long)filedata);
        bVar4 = compress(local_250,&filedata,original_filesize,&archive_filesize);
        if (bVar4) {
          std::ostream::write((char *)stream,(long)filedata);
        }
        else {
          original_filesize = 0;
          archive_filesize = 0;
        }
        if (filedata != (char *)0x0) {
          operator_delete__(filedata);
        }
        filedata = (char *)0x0;
        std::ifstream::close();
      }
      uVar5 = std::ostream::tellp();
      std::ostream::seekp(stream,*puVar6,0);
      (anonymous_namespace)::writeField<unsigned_int*>(stream,&index);
      (anonymous_namespace)::writeField<unsigned_int*>(stream,&original_filesize);
      (anonymous_namespace)::writeField<unsigned_int*>(stream,&archive_filesize);
      std::ostream::seekp(stream,uVar5,0);
      puVar6 = puVar6 + 1;
      std::ifstream::~ifstream(&entryFile);
    }
    operator_delete__(local_248);
  }
  return bVar2;
}

Assistant:

bool ArchiveBuilder::build(std::ostream &stream, Compression compression)
	{
		if (!supportsCompression(compression))
		{
			return false;
		}

		// Header
		writeField(stream, MAGIC_CHARS); // Magic
		writeField(stream, static_cast<std::uint8_t>(Version::CURRENT)); // Version
		writeField(stream, static_cast<std::uint8_t>(compression)); // Compression

		// Build lookup table
		std::uint32_t tableSize = static_cast<std::uint32_t>(files.size());
		writeField(stream, &tableSize); // Table size

		std::uint32_t *fillIn = new std::uint32_t[tableSize];
		std::uint32_t *currFillIn = &fillIn[0];
		for (const Entry &entry : files)
		{
			stream.write(entry.virtual_path.c_str(), sizeof(char)*entry.virtual_path.size()+1);

			// We don't know these values yet
			(*currFillIn) = static_cast<std::uint32_t>(stream.tellp());
			writeField(stream, 0); // File index
			writeField(stream, 0); // Original file size
			writeField(stream, 0); // Archive file size

			++currFillIn;
		}
		currFillIn = &fillIn[0];

		// Build data block
		for (const Entry &entry : files)
		{
			std::uint32_t index = static_cast<std::uint32_t>(stream.tellp());
			std::uint32_t original_filesize = 0;
			std::uint32_t archive_filesize = 0;

			std::ifstream entryFile(entry.real_path, std::ios::in | std::ios::binary | std::ios::ate);
			if (entryFile.is_open())
			{
				original_filesize = static_cast<std::uint32_t>(entryFile.tellg());
				entryFile.seekg(0);

				// Write file data
				char *filedata = new char[original_filesize];
				entryFile.read(filedata, original_filesize);

				if (compress(compression, filedata, original_filesize, archive_filesize))
				{
					stream.write(filedata, archive_filesize);
				}
				else
				{
					original_filesize = 0;
					archive_filesize  = 0;
				}

				delete[] filedata;
				filedata = nullptr;

				entryFile.close();
			}

			// Fill in header
			std::uint32_t bpos = static_cast<std::uint32_t>(stream.tellp());
			std::uint32_t pos = (*currFillIn);
			stream.seekp(pos);

			writeField(stream, &index);
			writeField(stream, &original_filesize);
			writeField(stream, &archive_filesize);

			stream.seekp(bpos);

			++currFillIn;
		}

		delete[] fillIn;
		fillIn = nullptr;
		currFillIn = nullptr;

		return true;
	}